

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
vkt::shaderexecutor::SquareMatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Inverse>::
createCase(MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          SquareMatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Inverse> *this,
          CaseContext *ctx)

{
  TestContext *testCtx;
  TestCaseGroup *context;
  TestNode *pTVar1;
  char *name;
  char *description;
  Inverse<2> *func;
  PrecisionCase *node;
  DefaultDeleter<tcu::TestNode> local_5a;
  allocator<char> local_59;
  string local_58;
  TestNode *local_28;
  TestCaseGroup *group;
  CaseContext *ctx_local;
  SquareMatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Inverse> *this_local;
  
  group = (TestCaseGroup *)ctx;
  ctx_local = (CaseContext *)this;
  this_local = (SquareMatrixFuncCaseFactory<vkt::shaderexecutor::Functions::Inverse> *)
               __return_storage_ptr__;
  pTVar1 = (TestNode *)operator_new(0x70);
  testCtx = (TestContext *)(group->super_TestNode).m_name.field_2._M_allocated_capacity;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,name,description);
  context = group;
  local_28 = pTVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mat2",&local_59);
  func = instance<vkt::shaderexecutor::Functions::Inverse<2>>();
  node = createFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                   ((CaseContext *)context,&local_58,
                    (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                     *)func);
  tcu::TestNode::addChild(pTVar1,(TestNode *)node);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = local_28;
  de::DefaultDeleter<tcu::TestNode>::DefaultDeleter(&local_5a);
  de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::MovePtr
            (__return_storage_ptr__,pTVar1);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const CaseContext& ctx) const
	{
		TestCaseGroup* group = new TestCaseGroup(ctx.testContext, ctx.name.c_str(), ctx.name.c_str());

		group->addChild(createFuncCase(ctx, "mat2", instance<GenF<2> >()));
#if 0
		// disabled until we get reasonable results
		group->addChild(createFuncCase(ctx, "mat3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "mat4", instance<GenF<4> >()));
#endif

		return MovePtr<TestNode>(group);
	}